

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkExtractCisForThisRead(Vec_Int_t *vReachReadCi,int iRead)

{
  int iVar1;
  Vec_Int_t *p;
  int iVar2;
  int i;
  
  p = Vec_IntAlloc(100);
  i = 2;
  for (iVar2 = 0; iVar2 < vReachReadCi->nSize / 3; iVar2 = iVar2 + 1) {
    iVar1 = Vec_IntEntry(vReachReadCi,i + -2);
    if (iVar1 == iRead) {
      iVar1 = Vec_IntEntry(vReachReadCi,i + -1);
      Vec_IntPush(p,iVar1);
      iVar1 = Vec_IntEntry(vReachReadCi,i);
      Vec_IntPush(p,iVar1);
    }
    i = i + 3;
  }
  return p;
}

Assistant:

Vec_Int_t * Wlc_NtkExtractCisForThisRead( Vec_Int_t * vReachReadCi, int iRead )
{
    int k;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    for ( k = 0; k < Vec_IntSize(vReachReadCi)/3; k++ )
    {
        if ( iRead != Vec_IntEntry( vReachReadCi, 3*k ) )
            continue;
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+1 ) );
        Vec_IntPush( vRes, Vec_IntEntry( vReachReadCi, 3*k+2 ) );
    }
    return vRes;
}